

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall
rsg::TexLookup::TexLookup(TexLookup *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ExecValueStorage *this_00;
  VariableManager *pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deBool dVar5;
  deUint32 dVar6;
  ShaderParameters *pSVar7;
  Variable *variable;
  pointer ppVVar8;
  Type TVar9;
  pointer ppVVar10;
  pointer ppVVar11;
  int ndx;
  int iVar12;
  ValueEntry *val_1;
  ValueEntry *pVVar13;
  Type val;
  vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> local_a8;
  ExecValueStorage *local_90;
  deRandom *local_88;
  VariableType local_80;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__TexLookup_0217f710;
  this->m_type = TYPE_LAST;
  this->m_coordExpr = (Expression *)0x0;
  this->m_lodBiasExpr = (Expression *)0x0;
  (this->m_valueType).m_baseType = TYPE_FLOAT;
  (this->m_valueType).m_precision = PRECISION_NONE;
  (this->m_valueType).m_typeName._M_dataplus._M_p = (pointer)&(this->m_valueType).m_typeName.field_2
  ;
  (this->m_valueType).m_typeName._M_string_length = 0;
  (this->m_valueType).m_typeName.field_2._M_local_buf[0] = '\0';
  (this->m_valueType).m_numElements = 4;
  (this->m_valueType).m_elementType = (VariableType *)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->m_value;
  ValueStorage<64>::ValueStorage(this_00,&this->m_valueType);
  local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (Type *)0x0;
  local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (Type *)0x0;
  local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Type *)0x0;
  pSVar7 = state->m_shaderParams;
  local_90 = this_00;
  if (pSVar7->useTexture2D == true) {
    local_80.m_baseType = TYPE_VOID;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
    _M_realloc_insert<rsg::TexLookup::Type>(&local_a8,(iterator)0x0,&local_80.m_baseType);
    local_80.m_baseType = TYPE_FLOAT;
    if (local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_80.m_baseType);
    }
    else {
      *local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURE2D_LOD;
      local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_80.m_baseType = TYPE_INT;
    if (local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_80.m_baseType);
    }
    else {
      *local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURE2D_PROJ;
      local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_80.m_baseType = TYPE_BOOL;
    if (local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_80.m_baseType);
    }
    else {
      *local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURE2D_PROJ_LOD;
      local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pSVar7 = state->m_shaderParams;
  }
  if (pSVar7->useTextureCube == true) {
    local_80.m_baseType = TYPE_STRUCT;
    if (local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_80.m_baseType);
    }
    else {
      *local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURECUBE;
      local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_80.m_baseType = TYPE_ARRAY;
    if (local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
      _M_realloc_insert<rsg::TexLookup::Type>
                (&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_80.m_baseType);
    }
    else {
      *local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
       _M_impl.super__Vector_impl_data._M_finish = TYPE_TEXTURECUBE_LOD;
      local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  local_80.m_baseType = TYPE_TEXTURE2D;
  de::Random::
  choose<__gnu_cxx::__normal_iterator<rsg::TexLookup::Type*,std::vector<rsg::TexLookup::Type,std::allocator<rsg::TexLookup::Type>>>,rsg::TexLookup::Type*>
            (state->m_random,
             (__normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
              )local_a8.
               super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
              )local_a8.
               super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_80.m_baseType,1);
  this->m_type = local_80.m_baseType;
  if (local_80.m_baseType < TYPE_TEXTURECUBE) {
    TVar9 = TYPE_LAST;
    bVar2 = true;
  }
  else {
    if (local_80.m_baseType - TYPE_TEXTURECUBE < 2) {
      TVar9 = TYPE_LAST|TYPE_TEXTURE2D_LOD;
    }
    else {
      TVar9 = 8;
    }
    bVar2 = false;
  }
  iVar3 = countSamplers(state->m_varManager,TYPE_SAMPLER_2D);
  iVar4 = countSamplers(state->m_varManager,TYPE_SAMPLER_CUBE);
  iVar12 = iVar4;
  if (bVar2) {
    iVar12 = iVar3;
  }
  if ((iVar12 < 1) ||
     ((iVar4 + iVar3 < state->m_shaderParams->maxSamplers &&
      (dVar5 = deRandom_getBool(&state->m_random->m_rnd), dVar5 == 1)))) {
    local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
    local_80.m_precision = PRECISION_NONE;
    local_80.m_typeName._M_string_length = 0;
    local_80.m_typeName.field_2._M_local_buf[0] = '\0';
    local_80.m_numElements = 1;
    local_80.m_elementType = (VariableType *)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80.m_baseType = TVar9;
    variable = VariableManager::allocate(state->m_varManager,&local_80);
    VariableType::~VariableType(&local_80);
    VariableManager::setStorage(state->m_varManager,variable,STORAGE_UNIFORM);
  }
  else {
    local_88 = &state->m_random->m_rnd;
    pVVar1 = state->m_varManager;
    ppVVar8 = (pVVar1->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVVar11 = ppVVar8;
    ppVVar10 = ppVVar8;
    if (ppVVar8 !=
        (pVVar1->m_entryCache).
        super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar2 = rsg::anon_unknown_0::IsSamplerEntry::operator()
                          ((IsSamplerEntry *)(ulong)TVar9,(ValueEntry *)(*ppVVar10)->m_variable);
        ppVVar8 = (pVVar1->m_entryCache).
                  super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar2) break;
        ppVVar10 = ppVVar10 + 1;
      } while (ppVVar10 != ppVVar8);
      ppVVar11 = (state->m_varManager->m_entryCache).
                 super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    pVVar13 = (ValueEntry *)0x0;
    iVar12 = 0;
    do {
      if ((iVar12 < 1) || (dVar6 = deRandom_getUint32(local_88), dVar6 % (iVar12 + 1U) == 0)) {
        pVVar13 = *ppVVar10;
      }
      do {
        ppVVar10 = ppVVar10 + 1;
        if (ppVVar10 == ppVVar8) break;
        bVar2 = rsg::anon_unknown_0::IsSamplerEntry::operator()
                          ((IsSamplerEntry *)(ulong)TVar9,(ValueEntry *)(*ppVVar10)->m_variable);
      } while (!bVar2);
      iVar12 = iVar12 + 1;
    } while (ppVVar10 != ppVVar11);
    variable = pVVar13->m_variable;
  }
  this->m_sampler = variable;
  if (local_a8.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
      _M_impl.super__Vector_impl_data._M_start != (Type *)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TexLookup::TexLookup (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_type			(TYPE_LAST)
	, m_coordExpr		(DE_NULL)
	, m_lodBiasExpr		(DE_NULL)
	, m_valueType		(VariableType::TYPE_FLOAT, 4)
	, m_value			(m_valueType)
{
	DE_ASSERT(valueRange.getType() == VariableType(VariableType::TYPE_FLOAT, 4));
	DE_UNREF(valueRange); // Texture output value range is constant.

	// Select type.
	vector<Type> typeCandidates;
	if (state.getShaderParameters().useTexture2D)
	{
		typeCandidates.push_back(TYPE_TEXTURE2D);
		typeCandidates.push_back(TYPE_TEXTURE2D_LOD);
		typeCandidates.push_back(TYPE_TEXTURE2D_PROJ);
		typeCandidates.push_back(TYPE_TEXTURE2D_PROJ_LOD);
	}

	if (state.getShaderParameters().useTextureCube)
	{
		typeCandidates.push_back(TYPE_TEXTURECUBE);
		typeCandidates.push_back(TYPE_TEXTURECUBE_LOD);
	}

	m_type = state.getRandom().choose<Type>(typeCandidates.begin(), typeCandidates.end());

	// Select or allocate sampler.
	VariableType::Type samplerType = VariableType::TYPE_LAST;
	switch (m_type)
	{
		case TYPE_TEXTURE2D:
		case TYPE_TEXTURE2D_LOD:
		case TYPE_TEXTURE2D_PROJ:
		case TYPE_TEXTURE2D_PROJ_LOD:
			samplerType = VariableType::TYPE_SAMPLER_2D;
			break;

		case TYPE_TEXTURECUBE:
		case TYPE_TEXTURECUBE_LOD:
			samplerType = VariableType::TYPE_SAMPLER_CUBE;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	int		sampler2DCount		= countSamplers(state.getVariableManager(), VariableType::TYPE_SAMPLER_2D);
	int		samplerCubeCount	= countSamplers(state.getVariableManager(), VariableType::TYPE_SAMPLER_CUBE);
	bool	canAllocSampler		= sampler2DCount + samplerCubeCount < state.getShaderParameters().maxSamplers;
	bool	hasSampler			= samplerType == VariableType::TYPE_SAMPLER_2D ? (sampler2DCount > 0) : (samplerCubeCount > 0);
	bool	allocSampler		= !hasSampler || (canAllocSampler && state.getRandom().getBool());

	if (allocSampler)
	{
		Variable* sampler = state.getVariableManager().allocate(VariableType(samplerType, 1));
		state.getVariableManager().setStorage(sampler, Variable::STORAGE_UNIFORM); // Samplers are always uniforms.
		m_sampler = sampler;
	}
	else
		m_sampler = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin(IsSamplerEntry(samplerType)),
															    state.getVariableManager().getEnd(IsSamplerEntry(samplerType)))->getVariable();
}